

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

Ea<(moira::Mode)10,_1> * __thiscall
moira::Moira::Op<(moira::Mode)10,1>
          (Ea<(moira::Mode)10,_1> *__return_storage_ptr__,Moira *this,u16 reg,u32 *pc)

{
  u32 uVar1;
  ushort uVar2;
  u8 uVar3;
  u8 uVar4;
  
  __return_storage_ptr__->reg = reg;
  __return_storage_ptr__->pc = *pc;
  uVar1 = dasmIncRead<2>(this,pc);
  __return_storage_ptr__->ext1 = uVar1;
  __return_storage_ptr__->ext2 = 0;
  __return_storage_ptr__->ext3 = 0;
  if ((uVar1 >> 8 & 1) == 0) {
    return __return_storage_ptr__;
  }
  uVar2 = (ushort)(uVar1 >> 4) & 3;
  uVar3 = (uVar2 == 3) + '\x01';
  if (uVar2 < 2) {
    uVar3 = '\0';
  }
  __return_storage_ptr__->dw = uVar3;
  uVar2 = (ushort)uVar1 & 3;
  uVar4 = (uVar2 == 3) + '\x01';
  if (uVar2 < 2) {
    uVar4 = '\0';
  }
  if ((~uVar1 & 0x44) == 0 && (this->instrStyle).syntax == MUSASHI) {
    uVar4 = '\0';
  }
  __return_storage_ptr__->ow = uVar4;
  if (uVar3 == '\x02') {
    uVar1 = dasmIncRead<4>(this,pc);
  }
  else {
    if (uVar3 != '\x01') goto LAB_0021b457;
    uVar1 = dasmIncRead<2>(this,pc);
    uVar1 = (u32)(short)uVar1;
  }
  __return_storage_ptr__->ext2 = uVar1;
LAB_0021b457:
  if (uVar4 == '\x02') {
    uVar1 = dasmIncRead<4>(this,pc);
  }
  else {
    if (uVar4 != '\x01') {
      return __return_storage_ptr__;
    }
    uVar1 = dasmIncRead<2>(this,pc);
    uVar1 = (u32)(short)uVar1;
  }
  __return_storage_ptr__->ext3 = uVar1;
  return __return_storage_ptr__;
}

Assistant:

Ea<M,S>
Moira::Op(u16 reg, u32 &pc) const
{
    Ea<M,S> result;
    result.reg = reg;
    result.pc = pc;

    // Read extension words
    switch (M)
    {
        case Mode(5):  // (d,An)
        case Mode(7):  // ABS.W
        case Mode(9):  // (d,PC)
        {
            result.ext1 = dasmIncRead<Word>(pc);
            break;
        }
        case Mode(8):  // ABS.L
        {
            result.ext1 = dasmIncRead<Word>(pc);
            result.ext1 = result.ext1 << 16 | dasmIncRead<Word>(pc);
            break;
        }
        case Mode(6):  // (d,An,Xi)
        case Mode(10): // (d,PC,Xi)
        {
            result.ext1 = dasmIncRead<Word>(pc);
            result.ext2 = 0;
            result.ext3 = 0;

            if (result.ext1 & 0x100) {

                result.dw = u8(baseDispWords((u16)result.ext1));
                result.ow = u8(outerDispWords((u16)result.ext1));

                // Compensate Musashi bug (?)
                if (instrStyle.syntax == Syntax::MUSASHI && (result.ext1 & 0x47) >= 0x44) {

                    result.ow = 0;
                }

                if (result.dw == 1) result.ext2 = (i16)dasmIncRead<Word>(pc);
                if (result.dw == 2) result.ext2 = (i32)dasmIncRead<Long>(pc);
                if (result.ow == 1) result.ext3 = (i16)dasmIncRead<Word>(pc);
                if (result.ow == 2) result.ext3 = (i32)dasmIncRead<Long>(pc);
            }
            break;
        }
        case Mode(11): // Imm
        {
            result.ext1 = dasmIncRead<S>(pc);
            break;
        }
        default:
        {
            break;
        }
    }

    return result;
}